

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall
argsman_tests::CheckValueTest::CheckValue(CheckValueTest *this,uint flags,char *arg,Expect *expect)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  readonly_property<bool> rVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator pvVar6;
  iterator in_R9;
  string *psVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  check_type cVar9;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  undefined1 *local_6f8;
  undefined1 *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  undefined1 *local_6c8;
  undefined1 *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  undefined1 *local_698;
  undefined1 *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  char *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  char *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  char *local_568;
  char *local_560;
  allocator<char> local_551;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  allocator<char> local_3c9;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  uint flags_local;
  vector<UniValue,_std::allocator<UniValue>_> settings_list;
  string local_370;
  undefined1 local_350 [16];
  undefined1 *local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338 [4];
  undefined1 local_2f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  l;
  string error;
  char *argv [2];
  TestArgsManager test;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  flags_local = flags;
  TestArgsManager::TestArgsManager(&test);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[7],_unsigned_int_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)local_350,(char (*) [7])"-value",&flags_local);
  __l._M_len = 1;
  __l._M_array = (iterator)local_350;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)&error,__l,(allocator_type *)&l);
  TestArgsManager::SetupArgs
            (&test,(vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)&error);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)&error);
  std::__cxx11::string::~string((string *)local_350);
  argv[0] = "ignored";
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  argv[1] = arg;
  bVar2 = ArgsManager::ParseParameters
                    (&test.super_ArgsManager,2 - (uint)(arg == (char *)0x0),argv,&error);
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x77;
  file.m_begin = (iterator)&local_3a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_3b8,msg);
  l.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)((ulong)l.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  l.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01139f30;
  l.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_3c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_3c0 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"-value",&local_3c9);
  ArgsManager::GetSetting((SettingsValue *)local_350,&test.super_ArgsManager,&local_370);
  UniValue::write_abi_cxx11_((UniValue *)local_2f8,(int)local_350,(void *)0x0,0);
  UniValue::write_abi_cxx11_((UniValue *)&settings_list,(int)expect,(void *)0x0,0);
  pvVar5 = (iterator)0x2;
  pvVar6 = local_2f8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&l,&local_3c8,0x77,1,2,pvVar6,"test.GetSetting(\"-value\").write()",
             (UniValue *)&settings_list,"expect.setting.write()");
  std::__cxx11::string::~string((string *)&settings_list);
  std::__cxx11::string::~string((string *)local_2f8);
  UniValue::~UniValue((UniValue *)local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_350,"-value",(allocator<char> *)&l);
  ArgsManager::GetSettingsList(&settings_list,&test.super_ArgsManager,(string *)local_350);
  std::__cxx11::string::~string((string *)local_350);
  if ((expect->setting).typ == VNULL) {
LAB_00232a9c:
    local_3e0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_3d8 = "";
    local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = pvVar6;
    msg_00.m_begin = pvVar5;
    file_00.m_end = (iterator)0x7a;
    file_00.m_begin = (iterator)&local_3e0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3f0,
               msg_00);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_400 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_3f8 = "";
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(((long)settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x58);
    pvVar8 = &l;
    local_2f8._0_8_ = (ulong)(uint)local_2f8._4_4_ << 0x20;
    pvVar6 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_350,&local_400,0x7a,1,2,pvVar8,"settings_list.size()",local_2f8,"0U");
  }
  else {
    bVar3 = UniValue::isFalse(&expect->setting);
    if (bVar3) goto LAB_00232a9c;
    local_410 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_408 = "";
    local_420 = &boost::unit_test::basic_cstring<char_const>::null;
    local_418 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = pvVar6;
    msg_01.m_begin = pvVar5;
    file_01.m_end = (iterator)0x7c;
    file_01.m_begin = (iterator)&local_410;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_420,
               msg_01);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_430 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_428 = "";
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(((long)settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_start) / 0x58);
    pvVar8 = &l;
    local_2f8._0_4_ = 1;
    pvVar6 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_350,&local_430,0x7c,1,2,pvVar8,"settings_list.size()",local_2f8,"1U");
    local_440 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_02.m_end = (iterator)pvVar8;
    msg_02.m_begin = pvVar6;
    file_02.m_end = (iterator)0x7d;
    file_02.m_begin = (iterator)&local_440;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_450,
               msg_02);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_460 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_458 = "";
    UniValue::write_abi_cxx11_
              ((UniValue *)&l,
               (int)settings_list.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                    super__Vector_impl_data._M_start,(void *)0x0,0);
    UniValue::write_abi_cxx11_((UniValue *)local_2f8,(int)expect,(void *)0x0,0);
    pvVar6 = (iterator)0x2;
    pvVar8 = &l;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_350,&local_460,0x7d,1,2,pvVar8,"settings_list[0].write()",(UniValue *)local_2f8
               ,"expect.setting.write()");
    std::__cxx11::string::~string((string *)local_2f8);
    std::__cxx11::string::~string((string *)&l);
  }
  if (expect->error == (char *)0x0) {
    local_4d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_4c8 = "";
    local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar9 = 0x232f05;
    msg_05.m_end = (iterator)pvVar8;
    msg_05.m_begin = pvVar6;
    file_05.m_end = (iterator)0x84;
    file_05.m_begin = (iterator)&local_4d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_4e0,
               msg_05);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(l.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8._0_8_ = "success";
    local_2f8._8_8_ = "";
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_0113a070;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = local_2f8;
    local_4f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_4e8 = "";
    pvVar6 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar9,(size_t)&local_4f0,
               0x84);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_500 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_4f8 = "";
    local_510 = &boost::unit_test::basic_cstring<char_const>::null;
    local_508 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_06.m_end = pvVar5;
    msg_06.m_begin = pvVar6;
    file_06.m_end = (iterator)0x85;
    file_06.m_begin = (iterator)&local_500;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_510,
               msg_06);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_520 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_518 = "";
    pvVar6 = (iterator)0x2;
    psVar7 = &error;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
              (local_350,&local_520,0x85,1,2,psVar7,"error","","\"\"");
  }
  else {
    local_470 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_468 = "";
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    local_478 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar9 = 0x232d6f;
    msg_03.m_end = (iterator)pvVar8;
    msg_03.m_begin = pvVar6;
    file_03.m_end = (iterator)0x81;
    file_03.m_begin = (iterator)&local_470;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_480,
               msg_03);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(l.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar2);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8._0_8_ = "!success";
    local_2f8._8_8_ = "";
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_0113a070;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = local_2f8;
    local_490 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_488 = "";
    pvVar6 = &DAT_00000001;
    pvVar5 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar9,(size_t)&local_490,
               0x81);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_4a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_498 = "";
    local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_04.m_end = pvVar5;
    msg_04.m_begin = pvVar6;
    file_04.m_end = (iterator)0x82;
    file_04.m_begin = (iterator)&local_4a0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_4b0,
               msg_04);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_4c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_4b8 = "";
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(&error,expect->error,0);
    psVar7 = (string *)&l;
    pvVar6 = (iterator)0x3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::ne_impl,unsigned_long,unsigned_long>
              (local_350,&local_4c0,0x82,1,3,psVar7,"error.find(expect.error)",
               &std::__cxx11::string::npos,"std::string::npos");
  }
  if (expect->default_string == true) {
    local_530 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_528 = "";
    local_540 = &boost::unit_test::basic_cstring<char_const>::null;
    local_538 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_07.m_end = (iterator)psVar7;
    msg_07.m_begin = pvVar6;
    file_07.m_end = (iterator)0x89;
    file_07.m_begin = (iterator)&local_530;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_540,
               msg_07);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_550 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_548 = "";
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"-value",&local_3c9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"zzzzz",&local_551);
    ArgsManager::GetArg((string *)&l,&test.super_ArgsManager,(string *)local_2f8,&local_370);
    pvVar6 = (iterator)0x2;
    pvVar8 = &l;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_350,&local_550,0x89,1,2,pvVar8,"test.GetArg(\"-value\", \"zzzzz\")","zzzzz",
               "\"zzzzz\"");
LAB_00233296:
    std::__cxx11::string::~string((string *)&l);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)local_2f8);
  }
  else {
    if (expect->string_value != (char *)0x0) {
      local_568 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_560 = "";
      local_578 = &boost::unit_test::basic_cstring<char_const>::null;
      local_570 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_08.m_end = (iterator)psVar7;
      msg_08.m_begin = pvVar6;
      file_08.m_end = (iterator)0x8b;
      file_08.m_begin = (iterator)&local_568;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_578,
                 msg_08);
      local_350[8] = false;
      local_350._0_8_ = &PTR__lazy_ostream_01139f30;
      local_340 = boost::unit_test::lazy_ostream::inst;
      local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_588 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_580 = "";
      std::__cxx11::string::string<std::allocator<char>>((string *)local_2f8,"-value",&local_3c9);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"zzzzz",&local_551);
      ArgsManager::GetArg((string *)&l,&test.super_ArgsManager,(string *)local_2f8,&local_370);
      pvVar6 = (iterator)0x2;
      pvVar8 = &l;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char_const*>
                (local_350,&local_588,0x8b,1,2,pvVar8,"test.GetArg(\"-value\", \"zzzzz\")",
                 &expect->string_value,"expect.string_value");
      goto LAB_00233296;
    }
    local_598 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_590 = "";
    local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar9 = 0x233d60;
    msg_19.m_end = (iterator)psVar7;
    msg_19.m_begin = pvVar6;
    file_19.m_end = (iterator)0x8d;
    file_19.m_begin = (iterator)&local_598;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_5a8,
               msg_19);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(l.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,!bVar2);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8._0_8_ = "!success";
    local_2f8._8_8_ = "";
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_0113a070;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = local_2f8;
    local_5b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_5b0 = "";
    pvVar6 = &DAT_00000001;
    pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar9,(size_t)&local_5b8,
               0x8d);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (expect->default_int == true) {
    local_5c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_5c0 = "";
    local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_09.m_end = (iterator)pvVar8;
    msg_09.m_begin = pvVar6;
    file_09.m_end = (iterator)0x91;
    file_09.m_begin = (iterator)&local_5c8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_5d8,
               msg_09);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_5e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_5e0 = "";
    std::__cxx11::string::string<std::allocator<char>>((string *)&l,"-value",&local_3c9);
    local_2f8._0_8_ = ArgsManager::GetIntArg(&test.super_ArgsManager,(string *)&l,99999);
    pvVar6 = local_2f8;
    local_370._M_dataplus._M_p._0_4_ = 99999;
    pvVar5 = (iterator)0x2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_350,&local_5e8,0x91,1,2,pvVar6,"test.GetIntArg(\"-value\", 99999)",&local_370,
               "99999");
LAB_002334dd:
    std::__cxx11::string::~string((string *)&l);
  }
  else {
    if ((expect->int_value).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == true) {
      local_5f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_5f0 = "";
      local_608 = &boost::unit_test::basic_cstring<char_const>::null;
      local_600 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_10.m_end = (iterator)pvVar8;
      msg_10.m_begin = pvVar6;
      file_10.m_end = (iterator)0x93;
      file_10.m_begin = (iterator)&local_5f8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_608,
                 msg_10);
      local_350[8] = false;
      local_350._0_8_ = &PTR__lazy_ostream_01139f30;
      local_340 = boost::unit_test::lazy_ostream::inst;
      local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_618 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_610 = "";
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&l,"-value",(allocator<char> *)&local_370);
      local_2f8._0_8_ = ArgsManager::GetIntArg(&test.super_ArgsManager,(string *)&l,99999);
      pvVar6 = local_2f8;
      pvVar5 = (iterator)0x2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
                (local_350,&local_618,0x93,1,2,pvVar6,"test.GetIntArg(\"-value\", 99999)",
                 &expect->int_value,"*expect.int_value");
      goto LAB_002334dd;
    }
    local_628 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_620 = "";
    local_638 = &boost::unit_test::basic_cstring<char_const>::null;
    local_630 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar9 = 0x23351e;
    msg_11.m_end = (iterator)pvVar8;
    msg_11.m_begin = pvVar6;
    file_11.m_end = (iterator)0x95;
    file_11.m_begin = (iterator)&local_628;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_638,
               msg_11);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(CONCAT71(l.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2) ^ 1);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8._0_8_ = "!success";
    local_2f8._8_8_ = "";
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_0113a070;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = local_2f8;
    local_648 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_640 = "";
    pvVar5 = &DAT_00000001;
    pvVar6 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar9,(size_t)&local_648,
               0x95);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (expect->default_bool == true) {
    local_658 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_650 = "";
    local_668 = &boost::unit_test::basic_cstring<char_const>::null;
    local_660 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_12.m_end = pvVar6;
    msg_12.m_begin = pvVar5;
    file_12.m_end = (iterator)0x99;
    file_12.m_begin = (iterator)&local_658;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_668,
               msg_12);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_678 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_670 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&l,"-value",(allocator<char> *)&local_370);
    rVar4.super_class_property<bool>.value =
         (class_property<bool>)ArgsManager::GetBoolArg(&test.super_ArgsManager,(string *)&l,false);
    pvVar6 = local_2f8;
    local_3c9 = (allocator<char>)0x0;
    pvVar5 = (iterator)0x2;
    local_2f8[0] = rVar4.super_class_property<bool>.value;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_350,&local_678,0x99,1,2,pvVar6,"test.GetBoolArg(\"-value\", false)",&local_3c9,
               "false");
    std::__cxx11::string::~string((string *)&l);
    local_688 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_680 = "";
    local_698 = &boost::unit_test::basic_cstring<char_const>::null;
    local_690 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_13.m_end = pvVar6;
    msg_13.m_begin = pvVar5;
    file_13.m_end = (iterator)0x9a;
    file_13.m_begin = (iterator)&local_688;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_698,
               msg_13);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_6a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_6a0 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&l,"-value",(allocator<char> *)&local_370);
    local_2f8[0] = (class_property<bool>)
                   ArgsManager::GetBoolArg(&test.super_ArgsManager,(string *)&l,true);
    pvVar6 = local_2f8;
    local_3c9 = (allocator<char>)0x1;
    pvVar5 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_350,&local_6a8,0x9a,1,2,pvVar6,"test.GetBoolArg(\"-value\", true)",&local_3c9,
               "true");
  }
  else {
    if ((expect->bool_value).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_engaged != true) {
      local_718 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_710 = "";
      local_728 = &boost::unit_test::basic_cstring<char_const>::null;
      local_720 = &boost::unit_test::basic_cstring<char_const>::null;
      _cVar9 = 0x233a1f;
      msg_16.m_end = pvVar6;
      msg_16.m_begin = pvVar5;
      file_16.m_end = (iterator)0x9f;
      file_16.m_begin = (iterator)&local_718;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_728,
                 msg_16);
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)(CONCAT71(l.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2) ^ 1);
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      l.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2f8._0_8_ = "!success";
      local_2f8._8_8_ = "";
      local_350[8] = false;
      local_350._0_8_ = &PTR__lazy_ostream_0113a070;
      local_340 = boost::unit_test::lazy_ostream::inst;
      local_338[0]._0_8_ = local_2f8;
      local_738 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_730 = "";
      pvVar5 = &DAT_00000001;
      pvVar6 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar9,(size_t)&local_738
                 ,0x9f);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &l.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      goto LAB_00233ab8;
    }
    local_6b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_6b0 = "";
    local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_14.m_end = pvVar6;
    msg_14.m_begin = pvVar5;
    file_14.m_end = (iterator)0x9c;
    file_14.m_begin = (iterator)&local_6b8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_6c8,
               msg_14);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_6d8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_6d0 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&l,"-value",(allocator<char> *)&local_370);
    rVar4.super_class_property<bool>.value =
         (class_property<bool>)ArgsManager::GetBoolArg(&test.super_ArgsManager,(string *)&l,false);
    pvVar6 = local_2f8;
    pvVar5 = (iterator)0x2;
    local_2f8[0] = rVar4.super_class_property<bool>.value;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_350,&local_6d8,0x9c,1,2,pvVar6,"test.GetBoolArg(\"-value\", false)",
               &expect->bool_value,"*expect.bool_value");
    std::__cxx11::string::~string((string *)&l);
    local_6e8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_6e0 = "";
    local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_15.m_end = pvVar6;
    msg_15.m_begin = pvVar5;
    file_15.m_end = (iterator)0x9d;
    file_15.m_begin = (iterator)&local_6e8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_6f8,
               msg_15);
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_708 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_700 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&l,"-value",(allocator<char> *)&local_370);
    local_2f8[0] = (class_property<bool>)
                   ArgsManager::GetBoolArg(&test.super_ArgsManager,(string *)&l,true);
    pvVar6 = local_2f8;
    pvVar5 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_350,&local_708,0x9d,1,2,pvVar6,"test.GetBoolArg(\"-value\", true)",
               &expect->bool_value,"*expect.bool_value");
  }
  std::__cxx11::string::~string((string *)&l);
LAB_00233ab8:
  if ((expect->list_value).
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_engaged == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_350,"-value",(allocator<char> *)local_2f8);
    ArgsManager::GetArgs(&l,&test.super_ArgsManager,(string *)local_350);
    std::__cxx11::string::~string((string *)local_350);
    local_748 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_740 = "";
    local_758 = &boost::unit_test::basic_cstring<char_const>::null;
    local_750 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_17.m_end = pvVar6;
    msg_17.m_begin = pvVar5;
    file_17.m_end = (iterator)0xa4;
    file_17.m_begin = (iterator)&local_748;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_758,
               msg_17);
    boost::test_tools::tt_detail::equal_coll_impl::operator()
              ((assertion_result *)local_2f8,(equal_coll_impl *)&local_370,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )l.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )l.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                &(expect->list_value).
                 super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_payload._M_value.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl,
               *(pointer *)
                ((long)&(expect->list_value).
                        super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_payload._M_value.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                + 8));
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_01139f30;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    local_768 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_760 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_2f8,(lazy_ostream *)local_350,1,0xd,4,0xc734b7,
               (size_t)&local_768,0xa4,"l.end()","expect.list_value->begin()",
               "expect.list_value->end()");
    boost::detail::shared_count::~shared_count((shared_count *)(local_2f8 + 0x10));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&l);
  }
  else {
    local_778 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_770 = "";
    local_788 = &boost::unit_test::basic_cstring<char_const>::null;
    local_780 = &boost::unit_test::basic_cstring<char_const>::null;
    _cVar9 = 0x233c48;
    msg_18.m_end = pvVar6;
    msg_18.m_begin = pvVar5;
    file_18.m_end = (iterator)0xa6;
    file_18.m_begin = (iterator)&local_778;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_788,
               msg_18);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(CONCAT71(l.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar2) ^ 1);
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    l.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8._0_8_ = "!success";
    local_2f8._8_8_ = "";
    local_350[8] = false;
    local_350._0_8_ = &PTR__lazy_ostream_0113a070;
    local_340 = boost::unit_test::lazy_ostream::inst;
    local_338[0]._0_8_ = local_2f8;
    local_798 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
    ;
    local_790 = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&l,(lazy_ostream *)local_350,1,0,WARN,_cVar9,(size_t)&local_798,
               0xa6);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &l.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&settings_list);
  std::__cxx11::string::~string((string *)&error);
  ArgsManager::~ArgsManager(&test.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckValue(unsigned int flags, const char* arg, const Expect& expect)
    {
        TestArgsManager test;
        test.SetupArgs({{"-value", flags}});
        const char* argv[] = {"ignored", arg};
        std::string error;
        bool success = test.ParseParameters(arg ? 2 : 1, argv, error);

        BOOST_CHECK_EQUAL(test.GetSetting("-value").write(), expect.setting.write());
        auto settings_list = test.GetSettingsList("-value");
        if (expect.setting.isNull() || expect.setting.isFalse()) {
            BOOST_CHECK_EQUAL(settings_list.size(), 0U);
        } else {
            BOOST_CHECK_EQUAL(settings_list.size(), 1U);
            BOOST_CHECK_EQUAL(settings_list[0].write(), expect.setting.write());
        }

        if (expect.error) {
            BOOST_CHECK(!success);
            BOOST_CHECK_NE(error.find(expect.error), std::string::npos);
        } else {
            BOOST_CHECK(success);
            BOOST_CHECK_EQUAL(error, "");
        }

        if (expect.default_string) {
            BOOST_CHECK_EQUAL(test.GetArg("-value", "zzzzz"), "zzzzz");
        } else if (expect.string_value) {
            BOOST_CHECK_EQUAL(test.GetArg("-value", "zzzzz"), expect.string_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.default_int) {
            BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), 99999);
        } else if (expect.int_value) {
            BOOST_CHECK_EQUAL(test.GetIntArg("-value", 99999), *expect.int_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.default_bool) {
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), false);
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), true);
        } else if (expect.bool_value) {
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", false), *expect.bool_value);
            BOOST_CHECK_EQUAL(test.GetBoolArg("-value", true), *expect.bool_value);
        } else {
            BOOST_CHECK(!success);
        }

        if (expect.list_value) {
            auto l = test.GetArgs("-value");
            BOOST_CHECK_EQUAL_COLLECTIONS(l.begin(), l.end(), expect.list_value->begin(), expect.list_value->end());
        } else {
            BOOST_CHECK(!success);
        }
    }